

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary_unittest.cc
# Opt level: O0

void anon_unknown.dwarf_39a3::Test_TemplateDictionary_SetTemplateGlobalValue::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  TemplateString TVar7;
  TemplateString TVar8;
  TemplateString TVar9;
  TemplateString TVar10;
  TemplateString TVar11;
  TemplateString TVar12;
  TemplateString TVar13;
  TemplateString TVar14;
  TemplateString TVar15;
  TemplateString TVar16;
  TemplateString TVar17;
  bool bVar18;
  TemplateDictionary *pTVar19;
  TemplateString local_9e0;
  TemplateString local_9c0;
  TemplateString local_9a0;
  TemplateString local_980;
  TemplateString local_960;
  TemplateString local_940;
  TemplateString local_920;
  TemplateString local_900;
  TemplateString local_8e0;
  TemplateString local_8c0;
  TemplateString local_8a0;
  TemplateString local_880;
  TemplateString local_860;
  TemplateString local_840;
  TemplateString local_820;
  TemplateString local_800;
  TemplateString local_7e0;
  TemplateString local_7c0;
  TemplateString local_7a0;
  TemplateString local_780;
  TemplateString local_760;
  TemplateString local_740;
  TemplateString local_720;
  TemplateString local_700;
  TemplateString local_6e0;
  TemplateString local_6c0;
  TemplateString local_6a0;
  TemplateString local_680;
  TemplateString local_660;
  TemplateString local_640;
  TemplateString local_620;
  TemplateString local_600;
  TemplateString local_5e0;
  TemplateString local_5c0;
  TemplateString local_5a0;
  TemplateString local_580;
  TemplateString local_560;
  TemplateString local_540;
  TemplateString local_520;
  TemplateString local_500;
  TemplateString local_4e0;
  TemplateString local_4c0;
  TemplateString local_4a0;
  TemplateString local_480;
  TemplateString local_460;
  TemplateString local_440;
  TemplateString local_420;
  TemplateString local_400;
  TemplateString local_3e0;
  TemplateString local_3c0;
  TemplateString local_3a0;
  TemplateString local_380;
  TemplateString local_360;
  TemplateString local_340;
  TemplateString local_320;
  TemplateString local_300;
  TemplateDictionaryPeer local_2e0;
  TemplateDictionaryPeer includedict2_peer;
  TemplateDictionaryPeer subdict2_peer;
  size_t sStack_2c8;
  undefined8 local_2c0;
  TemplateId TStack_2b8;
  TemplateDictionary *includedict2;
  size_t sStack_2a0;
  bool local_298;
  undefined7 uStack_297;
  TemplateId TStack_290;
  TemplateDictionary *local_288;
  TemplateDictionary *subdict2;
  TemplateString local_260;
  TemplateString local_240;
  TemplateString local_220;
  TemplateString local_200;
  TemplateString local_1e0;
  TemplateString local_1c0;
  TemplateString local_1a0;
  TemplateString local_180;
  TemplateString local_160;
  TemplateDictionaryPeer local_140;
  TemplateDictionaryPeer includedict_peer;
  TemplateDictionaryPeer subsubdict_peer;
  TemplateDictionaryPeer subdict_peer;
  TemplateDictionaryPeer peer;
  size_t sStack_118;
  undefined8 local_110;
  TemplateId TStack_108;
  TemplateDictionary *includedict;
  size_t sStack_f0;
  bool local_e8;
  undefined7 uStack_e7;
  TemplateId TStack_e0;
  TemplateDictionary *local_d8;
  TemplateDictionary *subsubdict;
  TemplateString local_c0;
  TemplateDictionary *local_a0;
  TemplateDictionary *subdict;
  TemplateDictionary local_78 [8];
  TemplateDictionary dict;
  
  ctemplate::TemplateString::TemplateString
            ((TemplateString *)&subdict,"test_SetTemplateGlobalValue");
  ctemplate::TemplateDictionary::TemplateDictionary
            (local_78,(TemplateString *)&subdict,(UnsafeArena *)0x0);
  ctemplate::TemplateString::TemplateString(&local_c0,"section1");
  TVar1.length_ = local_c0.length_;
  TVar1.ptr_ = local_c0.ptr_;
  TVar1.is_immutable_ = local_c0.is_immutable_;
  TVar1._17_7_ = local_c0._17_7_;
  TVar1.id_ = local_c0.id_;
  local_a0 = (TemplateDictionary *)ctemplate::TemplateDictionary::AddSectionDictionary(TVar1);
  ctemplate::TemplateString::TemplateString((TemplateString *)&includedict,"section1\'s child");
  TVar2.length_ = sStack_f0;
  TVar2.ptr_ = (char *)includedict;
  TVar2.is_immutable_ = local_e8;
  TVar2._17_7_ = uStack_e7;
  TVar2.id_ = TStack_e0;
  local_d8 = (TemplateDictionary *)ctemplate::TemplateDictionary::AddSectionDictionary(TVar2);
  ctemplate::TemplateString::TemplateString((TemplateString *)&peer,"include1");
  TVar3.length_ = sStack_118;
  TVar3.ptr_ = (char *)peer.dict_;
  TVar3._16_8_ = local_110;
  TVar3.id_ = TStack_108;
  pTVar19 = (TemplateDictionary *)ctemplate::TemplateDictionary::AddIncludeDictionary(TVar3);
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&subdict_peer,local_78);
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&subsubdict_peer,local_a0);
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&includedict_peer,local_d8);
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&local_140,pTVar19);
  ctemplate::TemplateString::TemplateString(&local_160,"TEMPLATEVAL");
  ctemplate::TemplateString::TemplateString(&local_180,"templateval");
  TVar4.length_ = local_160.length_;
  TVar4.ptr_ = local_160.ptr_;
  TVar4.is_immutable_ = local_160.is_immutable_;
  TVar4._17_7_ = local_160._17_7_;
  TVar4.id_ = local_160.id_;
  TVar13.length_ = local_180.length_;
  TVar13.ptr_ = local_180.ptr_;
  TVar13.is_immutable_ = local_180.is_immutable_;
  TVar13._17_7_ = local_180._17_7_;
  TVar13.id_ = local_180.id_;
  ctemplate::TemplateDictionary::SetTemplateGlobalValue(TVar4,TVar13);
  ctemplate::TemplateString::TemplateString(&local_1a0,"TEMPLATEVAL");
  ctemplate::TemplateString::TemplateString(&local_1c0,"templateval");
  bVar18 = ctemplate::TemplateDictionaryPeer::ValueIs(&subdict_peer,&local_1a0,&local_1c0);
  if (((bVar18 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","peer.ValueIs(\"TEMPLATEVAL\", \"templateval\")");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_1e0,"TEMPLATEVAL");
  ctemplate::TemplateString::TemplateString(&local_200,"templateval");
  bVar18 = ctemplate::TemplateDictionaryPeer::ValueIs(&subsubdict_peer,&local_1e0,&local_200);
  if (((bVar18 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","subdict_peer.ValueIs(\"TEMPLATEVAL\", \"templateval\")");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_220,"TEMPLATEVAL");
  ctemplate::TemplateString::TemplateString(&local_240,"templateval");
  bVar18 = ctemplate::TemplateDictionaryPeer::ValueIs(&includedict_peer,&local_220,&local_240);
  if (((bVar18 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","subsubdict_peer.ValueIs(\"TEMPLATEVAL\", \"templateval\")"
           );
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_260,"TEMPLATEVAL");
  ctemplate::TemplateString::TemplateString((TemplateString *)&subdict2,"templateval");
  bVar18 = ctemplate::TemplateDictionaryPeer::ValueIs
                     (&local_140,&local_260,(TemplateString *)&subdict2);
  if (((bVar18 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "includedict_peer.ValueIs(\"TEMPLATEVAL\", \"templateval\")");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString((TemplateString *)&includedict2,"section2");
  TVar5.length_ = sStack_2a0;
  TVar5.ptr_ = (char *)includedict2;
  TVar5.is_immutable_ = local_298;
  TVar5._17_7_ = uStack_297;
  TVar5.id_ = TStack_290;
  local_288 = (TemplateDictionary *)ctemplate::TemplateDictionary::AddSectionDictionary(TVar5);
  ctemplate::TemplateString::TemplateString((TemplateString *)&subdict2_peer,"include2");
  TVar6.length_ = sStack_2c8;
  TVar6.ptr_ = (char *)subdict2_peer.dict_;
  TVar6._16_8_ = local_2c0;
  TVar6.id_ = TStack_2b8;
  pTVar19 = (TemplateDictionary *)ctemplate::TemplateDictionary::AddIncludeDictionary(TVar6);
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&includedict2_peer,local_288);
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&local_2e0,pTVar19);
  ctemplate::TemplateString::TemplateString(&local_300,"TEMPLATEVAL");
  ctemplate::TemplateString::TemplateString(&local_320,"templateval");
  bVar18 = ctemplate::TemplateDictionaryPeer::ValueIs(&includedict2_peer,&local_300,&local_320);
  if (((bVar18 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","subdict2_peer.ValueIs(\"TEMPLATEVAL\", \"templateval\")");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_340,"TEMPLATEVAL");
  ctemplate::TemplateString::TemplateString(&local_360,"templateval");
  bVar18 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_2e0,&local_340,&local_360);
  if (((bVar18 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "includedict2_peer.ValueIs(\"TEMPLATEVAL\", \"templateval\")");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_380,"TEMPLATEVAL2");
  ctemplate::TemplateString::TemplateString(&local_3a0,"templateval2");
  TVar7.length_ = local_380.length_;
  TVar7.ptr_ = local_380.ptr_;
  TVar7.is_immutable_ = local_380.is_immutable_;
  TVar7._17_7_ = local_380._17_7_;
  TVar7.id_ = local_380.id_;
  TVar14.length_ = local_3a0.length_;
  TVar14.ptr_ = local_3a0.ptr_;
  TVar14.is_immutable_ = local_3a0.is_immutable_;
  TVar14._17_7_ = local_3a0._17_7_;
  TVar14.id_ = local_3a0.id_;
  ctemplate::TemplateDictionary::SetTemplateGlobalValue(TVar7,TVar14);
  ctemplate::TemplateString::TemplateString(&local_3c0,"TEMPLATEVAL2");
  ctemplate::TemplateString::TemplateString(&local_3e0,"templateval2");
  bVar18 = ctemplate::TemplateDictionaryPeer::ValueIs(&subdict_peer,&local_3c0,&local_3e0);
  if (((bVar18 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","peer.ValueIs(\"TEMPLATEVAL2\", \"templateval2\")");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_400,"TEMPLATEVAL2");
  ctemplate::TemplateString::TemplateString(&local_420,"templateval2");
  bVar18 = ctemplate::TemplateDictionaryPeer::ValueIs(&subsubdict_peer,&local_400,&local_420);
  if (((bVar18 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","subdict_peer.ValueIs(\"TEMPLATEVAL2\", \"templateval2\")")
    ;
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_440,"TEMPLATEVAL2");
  ctemplate::TemplateString::TemplateString(&local_460,"templateval2");
  bVar18 = ctemplate::TemplateDictionaryPeer::ValueIs(&includedict_peer,&local_440,&local_460);
  if (((bVar18 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "subsubdict_peer.ValueIs(\"TEMPLATEVAL2\", \"templateval2\")");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_480,"TEMPLATEVAL2");
  ctemplate::TemplateString::TemplateString(&local_4a0,"templateval2");
  bVar18 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_140,&local_480,&local_4a0);
  if (((bVar18 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "includedict_peer.ValueIs(\"TEMPLATEVAL2\", \"templateval2\")");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_4c0,"TEMPLATEVAL2");
  ctemplate::TemplateString::TemplateString(&local_4e0,"templateval2");
  bVar18 = ctemplate::TemplateDictionaryPeer::ValueIs(&includedict2_peer,&local_4c0,&local_4e0);
  if (((bVar18 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","subdict2_peer.ValueIs(\"TEMPLATEVAL2\", \"templateval2\")"
           );
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_500,"TEMPLATEVAL2");
  ctemplate::TemplateString::TemplateString(&local_520,"templateval2");
  bVar18 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_2e0,&local_500,&local_520);
  if (((bVar18 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "includedict2_peer.ValueIs(\"TEMPLATEVAL2\", \"templateval2\")");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_540,"TEMPLATEVAL3");
  ctemplate::TemplateString::TemplateString(&local_560,"templateval3");
  TVar8.length_ = local_540.length_;
  TVar8.ptr_ = local_540.ptr_;
  TVar8.is_immutable_ = local_540.is_immutable_;
  TVar8._17_7_ = local_540._17_7_;
  TVar8.id_ = local_540.id_;
  TVar15.length_ = local_560.length_;
  TVar15.ptr_ = local_560.ptr_;
  TVar15.is_immutable_ = local_560.is_immutable_;
  TVar15._17_7_ = local_560._17_7_;
  TVar15.id_ = local_560.id_;
  ctemplate::TemplateDictionary::SetTemplateGlobalValue(TVar8,TVar15);
  ctemplate::TemplateString::TemplateString(&local_580,"TEMPLATEVAL3");
  ctemplate::TemplateString::TemplateString(&local_5a0,"templateval3");
  bVar18 = ctemplate::TemplateDictionaryPeer::ValueIs(&subdict_peer,&local_580,&local_5a0);
  if (((bVar18 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","peer.ValueIs(\"TEMPLATEVAL3\", \"templateval3\")");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_5c0,"TEMPLATEVAL3");
  ctemplate::TemplateString::TemplateString(&local_5e0,"templateval3");
  bVar18 = ctemplate::TemplateDictionaryPeer::ValueIs(&subsubdict_peer,&local_5c0,&local_5e0);
  if (((bVar18 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","subdict_peer.ValueIs(\"TEMPLATEVAL3\", \"templateval3\")")
    ;
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_600,"TEMPLATEVAL3");
  ctemplate::TemplateString::TemplateString(&local_620,"templateval3");
  bVar18 = ctemplate::TemplateDictionaryPeer::ValueIs(&includedict_peer,&local_600,&local_620);
  if (((bVar18 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "subsubdict_peer.ValueIs(\"TEMPLATEVAL3\", \"templateval3\")");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_640,"TEMPLATEVAL3");
  ctemplate::TemplateString::TemplateString(&local_660,"templateval3");
  bVar18 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_140,&local_640,&local_660);
  if (((bVar18 ^ 0xffU) & 1) == 0) {
    ctemplate::TemplateString::TemplateString(&local_680,"TEMPLATEVAL3");
    ctemplate::TemplateString::TemplateString(&local_6a0,"templateval3");
    bVar18 = ctemplate::TemplateDictionaryPeer::ValueIs(&includedict2_peer,&local_680,&local_6a0);
    if (((bVar18 ^ 0xffU) & 1) != 0) {
      fprintf(_stderr,"Check failed: %s\n",
              "subdict2_peer.ValueIs(\"TEMPLATEVAL3\", \"templateval3\")");
      exit(1);
    }
    ctemplate::TemplateString::TemplateString(&local_6c0,"TEMPLATEVAL3");
    ctemplate::TemplateString::TemplateString(&local_6e0,"templateval3");
    bVar18 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_2e0,&local_6c0,&local_6e0);
    if (((bVar18 ^ 0xffU) & 1) != 0) {
      fprintf(_stderr,"Check failed: %s\n",
              "includedict2_peer.ValueIs(\"TEMPLATEVAL3\", \"templateval3\")");
      exit(1);
    }
    ctemplate::TemplateString::TemplateString(&local_700,"TEMPLATEVAL2");
    ctemplate::TemplateString::TemplateString(&local_720,"subdictval");
    TVar9.length_ = local_700.length_;
    TVar9.ptr_ = local_700.ptr_;
    TVar9.is_immutable_ = local_700.is_immutable_;
    TVar9._17_7_ = local_700._17_7_;
    TVar9.id_ = local_700.id_;
    TVar16.length_ = local_720.length_;
    TVar16.ptr_ = local_720.ptr_;
    TVar16.is_immutable_ = local_720.is_immutable_;
    TVar16._17_7_ = local_720._17_7_;
    TVar16.id_ = local_720.id_;
    ctemplate::TemplateDictionary::SetValue(TVar9,TVar16);
    ctemplate::TemplateString::TemplateString(&local_740,"TEMPLATEVAL2");
    ctemplate::TemplateString::TemplateString(&local_760,"includedictval");
    TVar10.length_ = local_740.length_;
    TVar10.ptr_ = local_740.ptr_;
    TVar10.is_immutable_ = local_740.is_immutable_;
    TVar10._17_7_ = local_740._17_7_;
    TVar10.id_ = local_740.id_;
    TVar17.length_ = local_760.length_;
    TVar17.ptr_ = local_760.ptr_;
    TVar17.is_immutable_ = local_760.is_immutable_;
    TVar17._17_7_ = local_760._17_7_;
    TVar17.id_ = local_760.id_;
    ctemplate::TemplateDictionary::SetValue(TVar10,TVar17);
    ctemplate::TemplateString::TemplateString(&local_780,"TEMPLATEVAL2");
    ctemplate::TemplateString::TemplateString(&local_7a0,"templateval2");
    bVar18 = ctemplate::TemplateDictionaryPeer::ValueIs(&subdict_peer,&local_780,&local_7a0);
    if (((bVar18 ^ 0xffU) & 1) != 0) {
      fprintf(_stderr,"Check failed: %s\n","peer.ValueIs(\"TEMPLATEVAL2\", \"templateval2\")");
      exit(1);
    }
    ctemplate::TemplateString::TemplateString(&local_7c0,"TEMPLATEVAL2");
    ctemplate::TemplateString::TemplateString(&local_7e0,"subdictval");
    bVar18 = ctemplate::TemplateDictionaryPeer::ValueIs(&subsubdict_peer,&local_7c0,&local_7e0);
    if (((bVar18 ^ 0xffU) & 1) != 0) {
      fprintf(_stderr,"Check failed: %s\n","subdict_peer.ValueIs(\"TEMPLATEVAL2\", \"subdictval\")")
      ;
      exit(1);
    }
    ctemplate::TemplateString::TemplateString(&local_800,"TEMPLATEVAL2");
    ctemplate::TemplateString::TemplateString(&local_820,"subdictval");
    bVar18 = ctemplate::TemplateDictionaryPeer::ValueIs(&includedict_peer,&local_800,&local_820);
    if (((bVar18 ^ 0xffU) & 1) != 0) {
      fprintf(_stderr,"Check failed: %s\n",
              "subsubdict_peer.ValueIs(\"TEMPLATEVAL2\", \"subdictval\")");
      exit(1);
    }
    ctemplate::TemplateString::TemplateString(&local_840,"TEMPLATEVAL2");
    ctemplate::TemplateString::TemplateString(&local_860,"includedictval");
    bVar18 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_140,&local_840,&local_860);
    if (((bVar18 ^ 0xffU) & 1) != 0) {
      fprintf(_stderr,"Check failed: %s\n",
              "includedict_peer.ValueIs(\"TEMPLATEVAL2\", \"includedictval\")");
      exit(1);
    }
    ctemplate::TemplateString::TemplateString(&local_880,"TEMPLATEVAL2");
    ctemplate::TemplateString::TemplateString(&local_8a0,"templateval2");
    bVar18 = ctemplate::TemplateDictionaryPeer::ValueIs(&includedict2_peer,&local_880,&local_8a0);
    if (((bVar18 ^ 0xffU) & 1) != 0) {
      fprintf(_stderr,"Check failed: %s\n",
              "subdict2_peer.ValueIs(\"TEMPLATEVAL2\", \"templateval2\")");
      exit(1);
    }
    ctemplate::TemplateString::TemplateString(&local_8c0,"TEMPLATEVAL2");
    ctemplate::TemplateString::TemplateString(&local_8e0,"templateval2");
    bVar18 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_2e0,&local_8c0,&local_8e0);
    if (((bVar18 ^ 0xffU) & 1) == 0) {
      ctemplate::TemplateString::TemplateString(&local_900,"ShownTemplateGlobalSection");
      TVar11.length_ = local_900.length_;
      TVar11.ptr_ = local_900.ptr_;
      TVar11.is_immutable_ = local_900.is_immutable_;
      TVar11._17_7_ = local_900._17_7_;
      TVar11.id_ = local_900.id_;
      ctemplate::TemplateDictionary::ShowTemplateGlobalSection(TVar11);
      ctemplate::TemplateString::TemplateString(&local_920,"ShownTemplateGlobalSection");
      bVar18 = ctemplate::TemplateDictionaryPeer::IsHiddenSection(&subdict_peer,&local_920);
      if (bVar18) {
        fprintf(_stderr,"Check failed: %s\n",
                "!(peer.IsHiddenSection(\"ShownTemplateGlobalSection\"))");
        exit(1);
      }
      ctemplate::TemplateString::TemplateString(&local_940,"ShownTemplateGlobalSection");
      bVar18 = ctemplate::TemplateDictionaryPeer::IsHiddenSection(&includedict2_peer,&local_940);
      if (bVar18) {
        fprintf(_stderr,"Check failed: %s\n",
                "!(subdict2_peer.IsHiddenSection(\"ShownTemplateGlobalSection\"))");
        exit(1);
      }
      ctemplate::TemplateString::TemplateString(&local_960,"ShownTemplateGlobalSection");
      bVar18 = ctemplate::TemplateDictionaryPeer::IsHiddenSection(&includedict_peer,&local_960);
      if (bVar18) {
        fprintf(_stderr,"Check failed: %s\n",
                "!(subsubdict_peer.IsHiddenSection(\"ShownTemplateGlobalSection\"))");
        exit(1);
      }
      ctemplate::TemplateString::TemplateString(&local_980,"ShownFromAChild");
      TVar12.length_ = local_980.length_;
      TVar12.ptr_ = local_980.ptr_;
      TVar12.is_immutable_ = local_980.is_immutable_;
      TVar12._17_7_ = local_980._17_7_;
      TVar12.id_ = local_980.id_;
      ctemplate::TemplateDictionary::ShowTemplateGlobalSection(TVar12);
      ctemplate::TemplateString::TemplateString(&local_9a0,"ShownFromAChild");
      bVar18 = ctemplate::TemplateDictionaryPeer::IsHiddenSection(&subdict_peer,&local_9a0);
      if (!bVar18) {
        ctemplate::TemplateString::TemplateString(&local_9c0,"ShownFromAChild");
        bVar18 = ctemplate::TemplateDictionaryPeer::IsHiddenSection(&includedict_peer,&local_9c0);
        if (!bVar18) {
          ctemplate::TemplateString::TemplateString(&local_9e0,"NAVBAR_SECTION");
          ctemplate::TemplateDictionaryPeer::IsHiddenSection(&subdict_peer,&local_9e0);
          ctemplate::TemplateDictionary::~TemplateDictionary(local_78);
          return;
        }
        fprintf(_stderr,"Check failed: %s\n",
                "!(subsubdict_peer.IsHiddenSection(\"ShownFromAChild\"))");
        exit(1);
      }
      fprintf(_stderr,"Check failed: %s\n","!(peer.IsHiddenSection(\"ShownFromAChild\"))");
      exit(1);
    }
    fprintf(_stderr,"Check failed: %s\n",
            "includedict2_peer.ValueIs(\"TEMPLATEVAL2\", \"templateval2\")");
    exit(1);
  }
  fprintf(_stderr,"Check failed: %s\n",
          "includedict_peer.ValueIs(\"TEMPLATEVAL3\", \"templateval3\")");
  exit(1);
}

Assistant:

TEST(TemplateDictionary, SetTemplateGlobalValue) {
  // The functionality involving it passing across the included dictionaries
  // is also tested in TestAddIncludeDictionary
  TemplateDictionary dict("test_SetTemplateGlobalValue", NULL);
  TemplateDictionary* subdict = dict.AddSectionDictionary("section1");
  TemplateDictionary* subsubdict =
    subdict->AddSectionDictionary("section1's child");
  TemplateDictionary* includedict = dict.AddIncludeDictionary("include1");

  TemplateDictionaryPeer peer(&dict);
  TemplateDictionaryPeer subdict_peer(subdict);
  TemplateDictionaryPeer subsubdict_peer(subsubdict);
  TemplateDictionaryPeer includedict_peer(includedict);

  // Setting a template value after sub dictionaries are created should
  // affect the sub dictionaries as well.
  dict.SetTemplateGlobalValue("TEMPLATEVAL", "templateval");
  EXPECT_TRUE(peer.ValueIs("TEMPLATEVAL", "templateval"));
  EXPECT_TRUE(subdict_peer.ValueIs("TEMPLATEVAL", "templateval"));
  EXPECT_TRUE(subsubdict_peer.ValueIs("TEMPLATEVAL", "templateval"));
  EXPECT_TRUE(includedict_peer.ValueIs("TEMPLATEVAL", "templateval"));

  // sub dictionaries after you set the template value should also
  // get the template value
  TemplateDictionary* subdict2 = dict.AddSectionDictionary("section2");
  TemplateDictionary* includedict2 = dict.AddIncludeDictionary("include2");
  TemplateDictionaryPeer subdict2_peer(subdict2);
  TemplateDictionaryPeer includedict2_peer(includedict2);

  EXPECT_TRUE(subdict2_peer.ValueIs("TEMPLATEVAL", "templateval"));
  EXPECT_TRUE(includedict2_peer.ValueIs("TEMPLATEVAL", "templateval"));

  // setting a template value on a sub dictionary should affect all the other
  // sub dictionaries and the parent as well
  subdict->SetTemplateGlobalValue("TEMPLATEVAL2", "templateval2");
  EXPECT_TRUE(peer.ValueIs("TEMPLATEVAL2", "templateval2"));
  EXPECT_TRUE(subdict_peer.ValueIs("TEMPLATEVAL2", "templateval2"));
  EXPECT_TRUE(subsubdict_peer.ValueIs("TEMPLATEVAL2", "templateval2"));
  EXPECT_TRUE(includedict_peer.ValueIs("TEMPLATEVAL2", "templateval2"));
  EXPECT_TRUE(subdict2_peer.ValueIs("TEMPLATEVAL2", "templateval2"));
  EXPECT_TRUE(includedict2_peer.ValueIs("TEMPLATEVAL2", "templateval2"));

  includedict->SetTemplateGlobalValue("TEMPLATEVAL3", "templateval3");
  EXPECT_TRUE(peer.ValueIs("TEMPLATEVAL3", "templateval3"));
  EXPECT_TRUE(subdict_peer.ValueIs("TEMPLATEVAL3", "templateval3"));
  EXPECT_TRUE(subsubdict_peer.ValueIs("TEMPLATEVAL3", "templateval3"));
  EXPECT_TRUE(includedict_peer.ValueIs("TEMPLATEVAL3", "templateval3"));
  EXPECT_TRUE(subdict2_peer.ValueIs("TEMPLATEVAL3", "templateval3"));
  EXPECT_TRUE(includedict2_peer.ValueIs("TEMPLATEVAL3", "templateval3"));

  // you should be able to override a template value with a regular value
  // and the overwritten regular value should pass on to its children
  subdict->SetValue("TEMPLATEVAL2", "subdictval");
  includedict->SetValue("TEMPLATEVAL2", "includedictval");
  EXPECT_TRUE(peer.ValueIs("TEMPLATEVAL2", "templateval2"));
  EXPECT_TRUE(subdict_peer.ValueIs("TEMPLATEVAL2", "subdictval"));
  EXPECT_TRUE(subsubdict_peer.ValueIs("TEMPLATEVAL2", "subdictval"));
  EXPECT_TRUE(includedict_peer.ValueIs("TEMPLATEVAL2", "includedictval"));
  EXPECT_TRUE(subdict2_peer.ValueIs("TEMPLATEVAL2", "templateval2"));
  EXPECT_TRUE(includedict2_peer.ValueIs("TEMPLATEVAL2", "templateval2"));

  // A section shown template-globally will be shown in all its children.
  dict.ShowTemplateGlobalSection("ShownTemplateGlobalSection");
  EXPECT_FALSE(peer.IsHiddenSection("ShownTemplateGlobalSection"));

  EXPECT_FALSE(subdict2_peer.IsHiddenSection("ShownTemplateGlobalSection"));
  EXPECT_FALSE(subsubdict_peer.IsHiddenSection("ShownTemplateGlobalSection"));

  // Showing a template-global section in a child will show it in all templates
  // in the tree
  subdict->ShowTemplateGlobalSection("ShownFromAChild");
  EXPECT_FALSE(peer.IsHiddenSection("ShownFromAChild"));
  EXPECT_FALSE(subsubdict_peer.IsHiddenSection("ShownFromAChild"));

  // Asking for a section that doesn't exist shouldn't cause infinite recursion
  peer.IsHiddenSection("NAVBAR_SECTION");
}